

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O0

int LzmaDec_DecodeReal(CLzmaDec *p,SizeT limit,Byte *bufLimit)

{
  ushort uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ushort *puVar12;
  long lVar13;
  ulong uVar14;
  undefined1 *puVar15;
  byte *in_RDX;
  ulong in_RSI;
  undefined4 *in_RDI;
  bool bVar16;
  ptrdiff_t src;
  Byte *dest;
  SizeT pos;
  uint curLen;
  SizeT rem;
  uint i_1;
  UInt32 t;
  uint i;
  UInt32 mask;
  uint numDirectBits;
  uint posSlot;
  UInt32 distance_1;
  UInt16 *probLen;
  UInt32 distance;
  UInt16 *probLit;
  uint bit;
  uint offs;
  uint matchByte;
  uint symbol;
  uint posState;
  uint ttt;
  UInt32 bound;
  UInt16 *prob;
  UInt32 code;
  UInt32 range;
  Byte *buf;
  uint len;
  UInt32 checkDicSize;
  UInt32 processedPos;
  SizeT dicPos;
  SizeT dicBufSize;
  Byte *dic;
  uint lc;
  uint lpMask;
  uint pbMask;
  UInt32 rep3;
  UInt32 rep2;
  UInt32 rep1;
  UInt32 rep0;
  uint state;
  UInt16 *probs;
  ulong local_180;
  uint local_170;
  uint local_16c;
  ulong local_160;
  ulong local_148;
  uint local_12c;
  ulong local_128;
  undefined1 *local_100;
  ulong local_f8;
  uint local_ec;
  uint local_dc;
  uint local_d4;
  uint local_d0;
  int local_cc;
  uint local_c4;
  uint local_b4;
  uint local_a0;
  uint local_98;
  ushort *local_88;
  uint local_80;
  uint local_7c;
  byte *local_78;
  uint local_6c;
  uint local_64;
  ulong local_60;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  Byte *lim;
  
  lVar6 = *(long *)(in_RDI + 4);
  local_2c = in_RDI[0x12];
  local_30 = in_RDI[0x13];
  local_34 = in_RDI[0x14];
  local_38 = in_RDI[0x15];
  local_3c = in_RDI[0x16];
  uVar2 = in_RDI[2];
  uVar3 = in_RDI[1];
  uVar4 = *in_RDI;
  lVar7 = *(long *)(in_RDI + 6);
  uVar8 = *(ulong *)(in_RDI + 0xe);
  local_60 = *(ulong *)(in_RDI + 0xc);
  local_64 = in_RDI[0x10];
  uVar5 = in_RDI[0x11];
  local_6c = 0;
  local_78 = *(byte **)(in_RDI + 8);
  local_7c = in_RDI[10];
  local_80 = in_RDI[0xb];
  do {
    uVar9 = local_64 & (1 << ((byte)uVar2 & 0x1f)) - 1U;
    puVar12 = (ushort *)(lVar6 + (ulong)(local_2c << 4) * 2 + (ulong)uVar9 * 2);
    uVar1 = *puVar12;
    if (local_7c < 0x1000000) {
      local_7c = local_7c << 8;
      local_80 = local_80 << 8 | (uint)*local_78;
      local_78 = local_78 + 1;
    }
    uVar10 = (local_7c >> 0xb) * (uint)uVar1;
    if (local_80 < uVar10) {
      *puVar12 = uVar1 + (short)(0x800 - uVar1 >> 5);
      local_88 = (ushort *)(lVar6 + 0xe6c);
      if ((local_64 != 0) || (uVar5 != 0)) {
        local_128 = uVar8;
        if (local_60 != 0) {
          local_128 = local_60;
        }
        local_88 = (ushort *)
                   ((long)local_88 +
                   (ulong)((((local_64 & (1 << ((byte)uVar3 & 0x1f)) - 1U) << ((byte)uVar4 & 0x1f))
                           + ((int)(uint)*(byte *)(lVar7 + (local_128 - 1)) >>
                             (8 - (byte)uVar4 & 0x1f))) * 0x300) * 2);
      }
      local_64 = local_64 + 1;
      local_7c = uVar10;
      if (local_2c < 7) {
        if (local_2c < 4) {
          local_12c = local_2c;
        }
        else {
          local_12c = 3;
        }
        uVar1 = *(ushort *)((long)local_88 + 2);
        if (uVar10 < 0x1000000) {
          local_7c = uVar10 * 0x100;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar9 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar9) {
          *(ushort *)((long)local_88 + 2) = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_98 = 2;
          local_7c = uVar9;
        }
        else {
          local_7c = local_7c - uVar9;
          local_80 = local_80 - uVar9;
          *(ushort *)((long)local_88 + 2) = uVar1 - (uVar1 >> 5);
          local_98 = 3;
        }
        uVar1 = *(ushort *)((long)local_88 + (ulong)local_98 * 2);
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar9 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar9) {
          *(ushort *)((long)local_88 + (ulong)local_98 * 2) = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_98 = local_98 * 2;
          local_7c = uVar9;
        }
        else {
          local_7c = local_7c - uVar9;
          local_80 = local_80 - uVar9;
          *(ushort *)((long)local_88 + (ulong)local_98 * 2) = uVar1 - (uVar1 >> 5);
          local_98 = local_98 * 2 + 1;
        }
        uVar1 = *(ushort *)((long)local_88 + (ulong)local_98 * 2);
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar9 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar9) {
          *(ushort *)((long)local_88 + (ulong)local_98 * 2) = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_98 = local_98 * 2;
          local_7c = uVar9;
        }
        else {
          local_7c = local_7c - uVar9;
          local_80 = local_80 - uVar9;
          *(ushort *)((long)local_88 + (ulong)local_98 * 2) = uVar1 - (uVar1 >> 5);
          local_98 = local_98 * 2 + 1;
        }
        uVar1 = *(ushort *)((long)local_88 + (ulong)local_98 * 2);
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar9 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar9) {
          *(ushort *)((long)local_88 + (ulong)local_98 * 2) = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_98 = local_98 * 2;
          local_7c = uVar9;
        }
        else {
          local_7c = local_7c - uVar9;
          local_80 = local_80 - uVar9;
          *(ushort *)((long)local_88 + (ulong)local_98 * 2) = uVar1 - (uVar1 >> 5);
          local_98 = local_98 * 2 + 1;
        }
        uVar1 = *(ushort *)((long)local_88 + (ulong)local_98 * 2);
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar9 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar9) {
          *(ushort *)((long)local_88 + (ulong)local_98 * 2) = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_98 = local_98 * 2;
          local_7c = uVar9;
        }
        else {
          local_7c = local_7c - uVar9;
          local_80 = local_80 - uVar9;
          *(ushort *)((long)local_88 + (ulong)local_98 * 2) = uVar1 - (uVar1 >> 5);
          local_98 = local_98 * 2 + 1;
        }
        uVar1 = *(ushort *)((long)local_88 + (ulong)local_98 * 2);
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar9 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar9) {
          *(ushort *)((long)local_88 + (ulong)local_98 * 2) = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_98 = local_98 * 2;
          local_7c = uVar9;
        }
        else {
          local_7c = local_7c - uVar9;
          local_80 = local_80 - uVar9;
          *(ushort *)((long)local_88 + (ulong)local_98 * 2) = uVar1 - (uVar1 >> 5);
          local_98 = local_98 * 2 + 1;
        }
        uVar1 = *(ushort *)((long)local_88 + (ulong)local_98 * 2);
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar9 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar9) {
          *(ushort *)((long)local_88 + (ulong)local_98 * 2) = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_98 = local_98 * 2;
          local_7c = uVar9;
        }
        else {
          local_7c = local_7c - uVar9;
          local_80 = local_80 - uVar9;
          *(ushort *)((long)local_88 + (ulong)local_98 * 2) = uVar1 - (uVar1 >> 5);
          local_98 = local_98 * 2 + 1;
        }
        uVar1 = *(ushort *)((long)local_88 + (ulong)local_98 * 2);
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar9 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar9) {
          *(ushort *)((long)local_88 + (ulong)local_98 * 2) = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_98._0_1_ = (char)local_98 * '\x02';
          local_7c = uVar9;
        }
        else {
          local_7c = local_7c - uVar9;
          local_80 = local_80 - uVar9;
          *(ushort *)((long)local_88 + (ulong)local_98 * 2) = uVar1 - (uVar1 >> 5);
          local_98._0_1_ = (char)local_98 * '\x02' + '\x01';
        }
      }
      else {
        local_148 = uVar8;
        if (local_30 <= local_60) {
          local_148 = 0;
        }
        uVar9 = (uint)*(byte *)(lVar7 + (local_60 - local_30) + local_148);
        local_12c = 6;
        if (local_2c < 10) {
          local_12c = 3;
        }
        local_a0 = (uVar9 & 0x80) << 1;
        puVar12 = (ushort *)((long)local_88 + (ulong)local_a0 * 2 + 0x202);
        uVar1 = *puVar12;
        if (uVar10 < 0x1000000) {
          local_7c = uVar10 * 0x100;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar10 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar10) {
          *puVar12 = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_98 = 2;
          local_a0 = (local_a0 ^ 0xffffffff) & 0x100;
          local_7c = uVar10;
        }
        else {
          local_7c = local_7c - uVar10;
          local_80 = local_80 - uVar10;
          *puVar12 = uVar1 - (uVar1 >> 5);
          local_98 = 3;
        }
        uVar10 = uVar9 << 2 & local_a0;
        puVar12 = (ushort *)
                  ((long)local_88 + (ulong)local_a0 * 2 + (ulong)uVar10 * 2 + (ulong)local_98 * 2);
        uVar1 = *puVar12;
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar11 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar11) {
          *puVar12 = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_98 = local_98 * 2;
          uVar10 = uVar10 ^ 0xffffffff;
          local_7c = uVar11;
        }
        else {
          local_7c = local_7c - uVar11;
          local_80 = local_80 - uVar11;
          *puVar12 = uVar1 - (uVar1 >> 5);
          local_98 = local_98 * 2 + 1;
        }
        local_a0 = uVar10 & local_a0;
        uVar10 = uVar9 << 3 & local_a0;
        puVar12 = (ushort *)
                  ((long)local_88 + (ulong)local_a0 * 2 + (ulong)uVar10 * 2 + (ulong)local_98 * 2);
        uVar1 = *puVar12;
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar11 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar11) {
          *puVar12 = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_98 = local_98 * 2;
          uVar10 = uVar10 ^ 0xffffffff;
          local_7c = uVar11;
        }
        else {
          local_7c = local_7c - uVar11;
          local_80 = local_80 - uVar11;
          *puVar12 = uVar1 - (uVar1 >> 5);
          local_98 = local_98 * 2 + 1;
        }
        local_a0 = uVar10 & local_a0;
        uVar10 = uVar9 << 4 & local_a0;
        puVar12 = (ushort *)
                  ((long)local_88 + (ulong)local_a0 * 2 + (ulong)uVar10 * 2 + (ulong)local_98 * 2);
        uVar1 = *puVar12;
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar11 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar11) {
          *puVar12 = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_98 = local_98 * 2;
          uVar10 = uVar10 ^ 0xffffffff;
          local_7c = uVar11;
        }
        else {
          local_7c = local_7c - uVar11;
          local_80 = local_80 - uVar11;
          *puVar12 = uVar1 - (uVar1 >> 5);
          local_98 = local_98 * 2 + 1;
        }
        local_a0 = uVar10 & local_a0;
        uVar10 = uVar9 << 5 & local_a0;
        puVar12 = (ushort *)
                  ((long)local_88 + (ulong)local_a0 * 2 + (ulong)uVar10 * 2 + (ulong)local_98 * 2);
        uVar1 = *puVar12;
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar11 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar11) {
          *puVar12 = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_98 = local_98 * 2;
          uVar10 = uVar10 ^ 0xffffffff;
          local_7c = uVar11;
        }
        else {
          local_7c = local_7c - uVar11;
          local_80 = local_80 - uVar11;
          *puVar12 = uVar1 - (uVar1 >> 5);
          local_98 = local_98 * 2 + 1;
        }
        local_a0 = uVar10 & local_a0;
        uVar10 = uVar9 << 6 & local_a0;
        puVar12 = (ushort *)
                  ((long)local_88 + (ulong)local_a0 * 2 + (ulong)uVar10 * 2 + (ulong)local_98 * 2);
        uVar1 = *puVar12;
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar11 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar11) {
          *puVar12 = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_98 = local_98 * 2;
          uVar10 = uVar10 ^ 0xffffffff;
          local_7c = uVar11;
        }
        else {
          local_7c = local_7c - uVar11;
          local_80 = local_80 - uVar11;
          *puVar12 = uVar1 - (uVar1 >> 5);
          local_98 = local_98 * 2 + 1;
        }
        local_a0 = uVar10 & local_a0;
        uVar10 = uVar9 << 7 & local_a0;
        puVar12 = (ushort *)
                  ((long)local_88 + (ulong)local_a0 * 2 + (ulong)uVar10 * 2 + (ulong)local_98 * 2);
        uVar1 = *puVar12;
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar11 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar11) {
          *puVar12 = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_98 = local_98 * 2;
          uVar10 = uVar10 ^ 0xffffffff;
          local_7c = uVar11;
        }
        else {
          local_7c = local_7c - uVar11;
          local_80 = local_80 - uVar11;
          *puVar12 = uVar1 - (uVar1 >> 5);
          local_98 = local_98 * 2 + 1;
        }
        local_a0 = uVar10 & local_a0;
        puVar12 = (ushort *)
                  ((long)local_88 + (ulong)local_a0 * 2 + (ulong)(uVar9 << 8 & local_a0) * 2 +
                  (ulong)local_98 * 2);
        uVar1 = *puVar12;
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar9 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar9) {
          *puVar12 = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_98._0_1_ = (char)local_98 * '\x02';
          local_7c = uVar9;
        }
        else {
          local_80 = local_80 - uVar9;
          *puVar12 = uVar1 - (uVar1 >> 5);
          local_98._0_1_ = (char)local_98 * '\x02' + '\x01';
          local_7c = local_7c - uVar9;
        }
      }
      local_2c = local_2c - local_12c;
      *(char *)(lVar7 + local_60) = (char)local_98;
      local_60 = local_60 + 1;
    }
    else {
      local_7c = local_7c - uVar10;
      local_80 = local_80 - uVar10;
      *puVar12 = uVar1 - (uVar1 >> 5);
      puVar12 = (ushort *)(lVar6 + 0x180 + (ulong)local_2c * 2);
      uVar1 = *puVar12;
      if (local_7c < 0x1000000) {
        local_7c = local_7c * 0x100;
        local_80 = local_80 * 0x100 | (uint)*local_78;
        local_78 = local_78 + 1;
      }
      uVar10 = (local_7c >> 0xb) * (uint)uVar1;
      if (local_80 < uVar10) {
        *puVar12 = uVar1 + (short)(0x800 - uVar1 >> 5);
        local_2c = local_2c + 0xc;
        local_88 = (ushort *)(lVar6 + 0x664);
        local_7c = uVar10;
      }
      else {
        local_7c = local_7c - uVar10;
        local_80 = local_80 - uVar10;
        *puVar12 = uVar1 - (uVar1 >> 5);
        if ((uVar5 == 0) && (local_64 == 0)) {
          return 1;
        }
        puVar12 = (ushort *)(lVar6 + 0x198 + (ulong)local_2c * 2);
        uVar1 = *puVar12;
        if (local_7c < 0x1000000) {
          local_7c = local_7c * 0x100;
          local_80 = local_80 * 0x100 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar10 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar10) {
          *puVar12 = uVar1 + (short)(0x800 - uVar1 >> 5);
          puVar12 = (ushort *)(lVar6 + 0x1e0 + (ulong)(local_2c << 4) * 2 + (ulong)uVar9 * 2);
          uVar1 = *puVar12;
          local_7c = uVar10;
          if (uVar10 < 0x1000000) {
            local_7c = uVar10 * 0x100;
            local_80 = local_80 << 8 | (uint)*local_78;
            local_78 = local_78 + 1;
          }
          uVar10 = (local_7c >> 0xb) * (uint)uVar1;
          if (local_80 < uVar10) {
            *puVar12 = uVar1 + (short)(0x800 - uVar1 >> 5);
            local_160 = uVar8;
            if (local_30 <= local_60) {
              local_160 = 0;
            }
            *(undefined1 *)(lVar7 + local_60) =
                 *(undefined1 *)(lVar7 + (local_60 - local_30) + local_160);
            local_60 = local_60 + 1;
            local_64 = local_64 + 1;
            bVar16 = local_2c < 7;
            local_2c = 0xb;
            local_7c = uVar10;
            if (bVar16) {
              local_2c = 9;
            }
            goto LAB_009f866b;
          }
          local_7c = local_7c - uVar10;
          local_80 = local_80 - uVar10;
          *puVar12 = uVar1 - (uVar1 >> 5);
        }
        else {
          local_7c = local_7c - uVar10;
          local_80 = local_80 - uVar10;
          *puVar12 = uVar1 - (uVar1 >> 5);
          puVar12 = (ushort *)(lVar6 + 0x1b0 + (ulong)local_2c * 2);
          uVar1 = *puVar12;
          if (local_7c < 0x1000000) {
            local_7c = local_7c * 0x100;
            local_80 = local_80 * 0x100 | (uint)*local_78;
            local_78 = local_78 + 1;
          }
          uVar10 = (local_7c >> 0xb) * (uint)uVar1;
          if (local_80 < uVar10) {
            *puVar12 = uVar1 + (short)(0x800 - uVar1 >> 5);
            local_b4 = local_34;
            local_7c = uVar10;
          }
          else {
            local_7c = local_7c - uVar10;
            local_80 = local_80 - uVar10;
            *puVar12 = uVar1 - (uVar1 >> 5);
            puVar12 = (ushort *)(lVar6 + 0x1c8 + (ulong)local_2c * 2);
            uVar1 = *puVar12;
            if (local_7c < 0x1000000) {
              local_7c = local_7c * 0x100;
              local_80 = local_80 * 0x100 | (uint)*local_78;
              local_78 = local_78 + 1;
            }
            uVar10 = (local_7c >> 0xb) * (uint)uVar1;
            if (local_80 < uVar10) {
              *puVar12 = uVar1 + (short)(0x800 - uVar1 >> 5);
              local_b4 = local_38;
              local_7c = uVar10;
            }
            else {
              local_7c = local_7c - uVar10;
              local_80 = local_80 - uVar10;
              *puVar12 = uVar1 - (uVar1 >> 5);
              local_b4 = local_3c;
              local_3c = local_38;
            }
            local_38 = local_34;
          }
          local_34 = local_30;
          local_30 = local_b4;
        }
        bVar16 = local_2c < 7;
        local_2c = 0xb;
        if (bVar16) {
          local_2c = 8;
        }
        local_88 = (ushort *)(lVar6 + 0xa68);
      }
      uVar1 = *local_88;
      if (local_7c < 0x1000000) {
        local_7c = local_7c << 8;
        local_80 = local_80 << 8 | (uint)*local_78;
        local_78 = local_78 + 1;
      }
      uVar10 = (local_7c >> 0xb) * (uint)uVar1;
      if (local_80 < uVar10) {
        *local_88 = uVar1 + (short)(0x800 - uVar1 >> 5);
        uVar14 = (ulong)(uVar9 << 3);
        uVar1 = local_88[uVar14 + 3];
        local_7c = uVar10;
        if (uVar10 < 0x1000000) {
          local_7c = uVar10 * 0x100;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar9 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar9) {
          local_88[uVar14 + 3] = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_6c = 2;
          local_7c = uVar9;
        }
        else {
          local_7c = local_7c - uVar9;
          local_80 = local_80 - uVar9;
          local_88[uVar14 + 3] = uVar1 - (uVar1 >> 5);
          local_6c = 3;
        }
        uVar1 = local_88[uVar14 + (ulong)local_6c + 2];
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar9 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar9) {
          local_88[uVar14 + (ulong)local_6c + 2] = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_6c = local_6c * 2;
          local_7c = uVar9;
        }
        else {
          local_7c = local_7c - uVar9;
          local_80 = local_80 - uVar9;
          local_88[uVar14 + (ulong)local_6c + 2] = uVar1 - (uVar1 >> 5);
          local_6c = local_6c * 2 + 1;
        }
        uVar1 = local_88[uVar14 + (ulong)local_6c + 2];
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar9 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar9) {
          local_88[uVar14 + (ulong)local_6c + 2] = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_6c = local_6c * 2;
          local_7c = uVar9;
        }
        else {
          local_7c = local_7c - uVar9;
          local_80 = local_80 - uVar9;
          local_88[uVar14 + (ulong)local_6c + 2] = uVar1 - (uVar1 >> 5);
          local_6c = local_6c * 2 + 1;
        }
        local_6c = local_6c - 8;
      }
      else {
        local_7c = local_7c - uVar10;
        local_80 = local_80 - uVar10;
        *local_88 = uVar1 - (uVar1 >> 5);
        puVar12 = local_88 + 1;
        uVar1 = *puVar12;
        if (local_7c < 0x1000000) {
          local_7c = local_7c * 0x100;
          local_80 = local_80 * 0x100 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar10 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar10) {
          *puVar12 = uVar1 + (short)(0x800 - uVar1 >> 5);
          uVar14 = (ulong)(uVar9 << 3);
          uVar1 = local_88[uVar14 + 0x83];
          local_7c = uVar10;
          if (uVar10 < 0x1000000) {
            local_7c = uVar10 * 0x100;
            local_80 = local_80 << 8 | (uint)*local_78;
            local_78 = local_78 + 1;
          }
          uVar9 = (local_7c >> 0xb) * (uint)uVar1;
          if (local_80 < uVar9) {
            local_88[uVar14 + 0x83] = uVar1 + (short)(0x800 - uVar1 >> 5);
            local_6c = 2;
            local_7c = uVar9;
          }
          else {
            local_7c = local_7c - uVar9;
            local_80 = local_80 - uVar9;
            local_88[uVar14 + 0x83] = uVar1 - (uVar1 >> 5);
            local_6c = 3;
          }
          uVar1 = local_88[uVar14 + (ulong)local_6c + 0x82];
          if (local_7c < 0x1000000) {
            local_7c = local_7c << 8;
            local_80 = local_80 << 8 | (uint)*local_78;
            local_78 = local_78 + 1;
          }
          uVar9 = (local_7c >> 0xb) * (uint)uVar1;
          if (local_80 < uVar9) {
            local_88[uVar14 + (ulong)local_6c + 0x82] = uVar1 + (short)(0x800 - uVar1 >> 5);
            local_6c = local_6c * 2;
            local_7c = uVar9;
          }
          else {
            local_7c = local_7c - uVar9;
            local_80 = local_80 - uVar9;
            local_88[uVar14 + (ulong)local_6c + 0x82] = uVar1 - (uVar1 >> 5);
            local_6c = local_6c * 2 + 1;
          }
          uVar1 = local_88[uVar14 + (ulong)local_6c + 0x82];
          if (local_7c < 0x1000000) {
            local_7c = local_7c << 8;
            local_80 = local_80 << 8 | (uint)*local_78;
            local_78 = local_78 + 1;
          }
          uVar9 = (local_7c >> 0xb) * (uint)uVar1;
          if (local_80 < uVar9) {
            local_88[uVar14 + (ulong)local_6c + 0x82] = uVar1 + (short)(0x800 - uVar1 >> 5);
            local_6c = local_6c * 2;
            local_7c = uVar9;
          }
          else {
            local_7c = local_7c - uVar9;
            local_80 = local_80 - uVar9;
            local_88[uVar14 + (ulong)local_6c + 0x82] = uVar1 - (uVar1 >> 5);
            local_6c = local_6c * 2 + 1;
          }
        }
        else {
          local_7c = local_7c - uVar10;
          local_80 = local_80 - uVar10;
          *puVar12 = uVar1 - (uVar1 >> 5);
          local_6c = 1;
          do {
            uVar1 = local_88[(ulong)local_6c + 0x102];
            if (local_7c < 0x1000000) {
              local_7c = local_7c << 8;
              local_80 = local_80 << 8 | (uint)*local_78;
              local_78 = local_78 + 1;
            }
            uVar9 = (local_7c >> 0xb) * (uint)uVar1;
            if (local_80 < uVar9) {
              local_88[(ulong)local_6c + 0x102] = uVar1 + (short)(0x800 - uVar1 >> 5);
              local_6c = local_6c * 2;
              local_7c = uVar9;
            }
            else {
              local_7c = local_7c - uVar9;
              local_80 = local_80 - uVar9;
              local_88[(ulong)local_6c + 0x102] = uVar1 - (uVar1 >> 5);
              local_6c = local_6c * 2 + 1;
            }
          } while (local_6c < 0x100);
          local_6c = local_6c - 0xf0;
        }
      }
      if (0xb < local_2c) {
        if (local_6c < 4) {
          local_16c = local_6c;
        }
        else {
          local_16c = 3;
        }
        lVar13 = lVar6 + 0x360 + (ulong)(local_16c << 6) * 2;
        uVar1 = *(ushort *)(lVar13 + 2);
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar9 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar9) {
          *(ushort *)(lVar13 + 2) = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_c4 = 2;
          local_7c = uVar9;
        }
        else {
          local_7c = local_7c - uVar9;
          local_80 = local_80 - uVar9;
          *(ushort *)(lVar13 + 2) = uVar1 - (uVar1 >> 5);
          local_c4 = 3;
        }
        uVar1 = *(ushort *)(lVar13 + (ulong)local_c4 * 2);
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar9 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar9) {
          *(ushort *)(lVar13 + (ulong)local_c4 * 2) = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_c4 = local_c4 * 2;
          local_7c = uVar9;
        }
        else {
          local_7c = local_7c - uVar9;
          local_80 = local_80 - uVar9;
          *(ushort *)(lVar13 + (ulong)local_c4 * 2) = uVar1 - (uVar1 >> 5);
          local_c4 = local_c4 * 2 + 1;
        }
        uVar1 = *(ushort *)(lVar13 + (ulong)local_c4 * 2);
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar9 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar9) {
          *(ushort *)(lVar13 + (ulong)local_c4 * 2) = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_c4 = local_c4 * 2;
          local_7c = uVar9;
        }
        else {
          local_7c = local_7c - uVar9;
          local_80 = local_80 - uVar9;
          *(ushort *)(lVar13 + (ulong)local_c4 * 2) = uVar1 - (uVar1 >> 5);
          local_c4 = local_c4 * 2 + 1;
        }
        uVar1 = *(ushort *)(lVar13 + (ulong)local_c4 * 2);
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar9 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar9) {
          *(ushort *)(lVar13 + (ulong)local_c4 * 2) = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_c4 = local_c4 * 2;
          local_7c = uVar9;
        }
        else {
          local_7c = local_7c - uVar9;
          local_80 = local_80 - uVar9;
          *(ushort *)(lVar13 + (ulong)local_c4 * 2) = uVar1 - (uVar1 >> 5);
          local_c4 = local_c4 * 2 + 1;
        }
        uVar1 = *(ushort *)(lVar13 + (ulong)local_c4 * 2);
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar9 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar9) {
          *(ushort *)(lVar13 + (ulong)local_c4 * 2) = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_c4 = local_c4 * 2;
          local_7c = uVar9;
        }
        else {
          local_7c = local_7c - uVar9;
          local_80 = local_80 - uVar9;
          *(ushort *)(lVar13 + (ulong)local_c4 * 2) = uVar1 - (uVar1 >> 5);
          local_c4 = local_c4 * 2 + 1;
        }
        uVar1 = *(ushort *)(lVar13 + (ulong)local_c4 * 2);
        if (local_7c < 0x1000000) {
          local_7c = local_7c << 8;
          local_80 = local_80 << 8 | (uint)*local_78;
          local_78 = local_78 + 1;
        }
        uVar9 = (local_7c >> 0xb) * (uint)uVar1;
        if (local_80 < uVar9) {
          *(ushort *)(lVar13 + (ulong)local_c4 * 2) = uVar1 + (short)(0x800 - uVar1 >> 5);
          local_c4 = local_c4 * 2;
          local_7c = uVar9;
        }
        else {
          local_7c = local_7c - uVar9;
          local_80 = local_80 - uVar9;
          *(ushort *)(lVar13 + (ulong)local_c4 * 2) = uVar1 - (uVar1 >> 5);
          local_c4 = local_c4 * 2 + 1;
        }
        uVar9 = local_c4 - 0x40;
        local_c4 = uVar9;
        if (3 < uVar9) {
          local_cc = (uVar9 >> 1) - 1;
          local_c4 = uVar9 & 1 | 2;
          if (uVar9 < 0xe) {
            local_c4 = local_c4 << ((byte)local_cc & 0x1f);
            lVar13 = lVar6 + (ulong)local_c4 * 2 + (ulong)uVar9 * -2 + 0x55e;
            local_d0 = 1;
            local_d4 = 1;
            do {
              uVar1 = *(ushort *)(lVar13 + (ulong)local_d4 * 2);
              if (local_7c < 0x1000000) {
                local_7c = local_7c << 8;
                local_80 = local_80 << 8 | (uint)*local_78;
                local_78 = local_78 + 1;
              }
              uVar9 = (local_7c >> 0xb) * (uint)uVar1;
              if (local_80 < uVar9) {
                *(ushort *)(lVar13 + (ulong)local_d4 * 2) = uVar1 + (short)(0x800 - uVar1 >> 5);
                local_d4 = local_d4 * 2;
                local_7c = uVar9;
              }
              else {
                local_7c = local_7c - uVar9;
                local_80 = local_80 - uVar9;
                *(ushort *)(lVar13 + (ulong)local_d4 * 2) = uVar1 - (uVar1 >> 5);
                local_d4 = local_d4 * 2 + 1;
                local_c4 = local_d0 | local_c4;
              }
              local_d0 = local_d0 << 1;
              local_cc = local_cc + -1;
            } while (local_cc != 0);
          }
          else {
            local_cc = (uVar9 >> 1) - 5;
            do {
              if (local_7c < 0x1000000) {
                local_7c = local_7c << 8;
                local_80 = local_80 << 8 | (uint)*local_78;
                local_78 = local_78 + 1;
              }
              local_7c = local_7c >> 1;
              uVar9 = (int)(local_80 - local_7c) >> 0x1f;
              local_c4 = local_c4 * 2 + uVar9 + 1;
              local_80 = (local_7c & uVar9) + (local_80 - local_7c);
              local_cc = local_cc + -1;
            } while (local_cc != 0);
            lVar13 = lVar6 + 0x644;
            local_c4 = local_c4 * 0x10;
            uVar1 = *(ushort *)(lVar6 + 0x646);
            if (local_7c < 0x1000000) {
              local_7c = local_7c << 8;
              local_80 = local_80 * 0x100 | (uint)*local_78;
              local_78 = local_78 + 1;
            }
            uVar9 = (local_7c >> 0xb) * (uint)uVar1;
            if (local_80 < uVar9) {
              *(ushort *)(lVar6 + 0x646) = uVar1 + (short)(0x800 - uVar1 >> 5);
              local_dc = 2;
              local_7c = uVar9;
            }
            else {
              local_7c = local_7c - uVar9;
              local_80 = local_80 - uVar9;
              *(ushort *)(lVar6 + 0x646) = uVar1 - (uVar1 >> 5);
              local_dc = 3;
              local_c4 = local_c4 | 1;
            }
            uVar1 = *(ushort *)(lVar13 + (ulong)local_dc * 2);
            if (local_7c < 0x1000000) {
              local_7c = local_7c << 8;
              local_80 = local_80 << 8 | (uint)*local_78;
              local_78 = local_78 + 1;
            }
            uVar9 = (local_7c >> 0xb) * (uint)uVar1;
            if (local_80 < uVar9) {
              *(ushort *)(lVar13 + (ulong)local_dc * 2) = uVar1 + (short)(0x800 - uVar1 >> 5);
              local_dc = local_dc * 2;
              local_7c = uVar9;
            }
            else {
              local_7c = local_7c - uVar9;
              local_80 = local_80 - uVar9;
              *(ushort *)(lVar13 + (ulong)local_dc * 2) = uVar1 - (uVar1 >> 5);
              local_dc = local_dc * 2 + 1;
              local_c4 = local_c4 | 2;
            }
            uVar1 = *(ushort *)(lVar13 + (ulong)local_dc * 2);
            if (local_7c < 0x1000000) {
              local_7c = local_7c << 8;
              local_80 = local_80 << 8 | (uint)*local_78;
              local_78 = local_78 + 1;
            }
            uVar9 = (local_7c >> 0xb) * (uint)uVar1;
            if (local_80 < uVar9) {
              *(ushort *)(lVar13 + (ulong)local_dc * 2) = uVar1 + (short)(0x800 - uVar1 >> 5);
              local_dc = local_dc * 2;
              local_7c = uVar9;
            }
            else {
              local_7c = local_7c - uVar9;
              local_80 = local_80 - uVar9;
              *(ushort *)(lVar13 + (ulong)local_dc * 2) = uVar1 - (uVar1 >> 5);
              local_dc = local_dc * 2 + 1;
              local_c4 = local_c4 | 4;
            }
            uVar1 = *(ushort *)(lVar13 + (ulong)local_dc * 2);
            if (local_7c < 0x1000000) {
              local_7c = local_7c << 8;
              local_80 = local_80 << 8 | (uint)*local_78;
              local_78 = local_78 + 1;
            }
            uVar9 = (local_7c >> 0xb) * (uint)uVar1;
            if (local_80 < uVar9) {
              *(ushort *)(lVar13 + (ulong)local_dc * 2) = uVar1 + (short)(0x800 - uVar1 >> 5);
              local_7c = uVar9;
            }
            else {
              local_7c = local_7c - uVar9;
              local_80 = local_80 - uVar9;
              *(ushort *)(lVar13 + (ulong)local_dc * 2) = uVar1 - (uVar1 >> 5);
              local_c4 = local_c4 | 8;
            }
            if (local_c4 == 0xffffffff) {
              local_6c = local_6c + 0x112;
              local_2c = local_2c - 0xc;
              goto LAB_009f86a6;
            }
          }
        }
        local_3c = local_38;
        local_38 = local_34;
        local_34 = local_30;
        local_30 = local_c4 + 1;
        if (uVar5 == 0) {
          if (local_64 <= local_c4) {
            *(ulong *)(in_RDI + 0xc) = local_60;
            return 1;
          }
        }
        else if (uVar5 <= local_c4) {
          *(ulong *)(in_RDI + 0xc) = local_60;
          return 1;
        }
        bVar16 = local_2c < 0x13;
        local_2c = 10;
        if (bVar16) {
          local_2c = 7;
        }
      }
      local_6c = local_6c + 2;
      uVar14 = in_RSI - local_60;
      if (uVar14 == 0) {
        *(ulong *)(in_RDI + 0xc) = local_60;
        return 1;
      }
      local_170 = local_6c;
      if (uVar14 < local_6c) {
        local_170 = (uint)uVar14;
      }
      local_ec = local_170;
      local_180 = uVar8;
      if (local_30 <= local_60) {
        local_180 = 0;
      }
      local_f8 = (local_60 - local_30) + local_180;
      local_64 = local_170 + local_64;
      local_6c = local_6c - local_170;
      if (uVar8 - local_f8 < (ulong)local_170) {
        do {
          uVar14 = local_60 + 1;
          *(undefined1 *)(lVar7 + local_60) = *(undefined1 *)(lVar7 + local_f8);
          local_f8 = local_f8 + 1;
          if (local_f8 == uVar8) {
            local_f8 = 0;
          }
          local_ec = local_ec - 1;
          local_60 = uVar14;
        } while (local_ec != 0);
      }
      else {
        local_100 = (undefined1 *)(lVar7 + local_60);
        lVar13 = local_f8 - local_60;
        puVar15 = local_100 + local_170;
        local_60 = local_170 + local_60;
        do {
          *local_100 = local_100[lVar13];
          local_100 = local_100 + 1;
        } while (local_100 != puVar15);
      }
    }
LAB_009f866b:
    if (in_RSI <= local_60 || in_RDX <= local_78) {
LAB_009f86a6:
      if (local_7c < 0x1000000) {
        local_7c = local_7c << 8;
        local_80 = local_80 << 8 | (uint)*local_78;
        local_78 = local_78 + 1;
      }
      *(byte **)(in_RDI + 8) = local_78;
      in_RDI[10] = local_7c;
      in_RDI[0xb] = local_80;
      in_RDI[0x17] = local_6c;
      *(ulong *)(in_RDI + 0xc) = local_60;
      in_RDI[0x10] = local_64;
      in_RDI[0x13] = local_30;
      in_RDI[0x14] = local_34;
      in_RDI[0x15] = local_38;
      in_RDI[0x16] = local_3c;
      in_RDI[0x12] = local_2c;
      return 0;
    }
  } while( true );
}

Assistant:

static int MY_FAST_CALL LzmaDec_DecodeReal(CLzmaDec *p, SizeT limit, const Byte *bufLimit)
{
  CLzmaProb *probs = p->probs;

  unsigned state = p->state;
  UInt32 rep0 = p->reps[0], rep1 = p->reps[1], rep2 = p->reps[2], rep3 = p->reps[3];
  unsigned pbMask = ((unsigned)1 << (p->prop.pb)) - 1;
  unsigned lpMask = ((unsigned)1 << (p->prop.lp)) - 1;
  unsigned lc = p->prop.lc;

  Byte *dic = p->dic;
  SizeT dicBufSize = p->dicBufSize;
  SizeT dicPos = p->dicPos;
  
  UInt32 processedPos = p->processedPos;
  UInt32 checkDicSize = p->checkDicSize;
  unsigned len = 0;

  const Byte *buf = p->buf;
  UInt32 range = p->range;
  UInt32 code = p->code;

  do
  {
    CLzmaProb *prob;
    UInt32 bound;
    unsigned ttt;
    unsigned posState = processedPos & pbMask;

    prob = probs + IsMatch + (state << kNumPosBitsMax) + posState;
    IF_BIT_0(prob)
    {
      unsigned symbol;
      UPDATE_0(prob);
      prob = probs + Literal;
      if (processedPos != 0 || checkDicSize != 0)
        prob += ((UInt32)LZMA_LIT_SIZE * (((processedPos & lpMask) << lc) +
            (dic[(dicPos == 0 ? dicBufSize : dicPos) - 1] >> (8 - lc))));
      processedPos++;

      if (state < kNumLitStates)
      {
        state -= (state < 4) ? state : 3;
        symbol = 1;
        #ifdef _LZMA_SIZE_OPT
        do { NORMAL_LITER_DEC } while (symbol < 0x100);
        #else
        NORMAL_LITER_DEC
        NORMAL_LITER_DEC
        NORMAL_LITER_DEC
        NORMAL_LITER_DEC
        NORMAL_LITER_DEC
        NORMAL_LITER_DEC
        NORMAL_LITER_DEC
        NORMAL_LITER_DEC
        #endif
      }
      else
      {
        unsigned matchByte = dic[dicPos - rep0 + (dicPos < rep0 ? dicBufSize : 0)];
        unsigned offs = 0x100;
        state -= (state < 10) ? 3 : 6;
        symbol = 1;
        #ifdef _LZMA_SIZE_OPT
        do
        {
          unsigned bit;
          CLzmaProb *probLit;
          MATCHED_LITER_DEC
        }
        while (symbol < 0x100);
        #else
        {
          unsigned bit;
          CLzmaProb *probLit;
          MATCHED_LITER_DEC
          MATCHED_LITER_DEC
          MATCHED_LITER_DEC
          MATCHED_LITER_DEC
          MATCHED_LITER_DEC
          MATCHED_LITER_DEC
          MATCHED_LITER_DEC
          MATCHED_LITER_DEC
        }
        #endif
      }

      dic[dicPos++] = (Byte)symbol;
      continue;
    }
    
    {
      UPDATE_1(prob);
      prob = probs + IsRep + state;
      IF_BIT_0(prob)
      {
        UPDATE_0(prob);
        state += kNumStates;
        prob = probs + LenCoder;
      }
      else
      {
        UPDATE_1(prob);
        if (checkDicSize == 0 && processedPos == 0)
          return SZ_ERROR_DATA;
        prob = probs + IsRepG0 + state;
        IF_BIT_0(prob)
        {
          UPDATE_0(prob);
          prob = probs + IsRep0Long + (state << kNumPosBitsMax) + posState;
          IF_BIT_0(prob)
          {
            UPDATE_0(prob);
            dic[dicPos] = dic[dicPos - rep0 + (dicPos < rep0 ? dicBufSize : 0)];
            dicPos++;
            processedPos++;
            state = state < kNumLitStates ? 9 : 11;
            continue;
          }
          UPDATE_1(prob);
        }
        else
        {
          UInt32 distance;
          UPDATE_1(prob);
          prob = probs + IsRepG1 + state;
          IF_BIT_0(prob)
          {
            UPDATE_0(prob);
            distance = rep1;
          }
          else
          {
            UPDATE_1(prob);
            prob = probs + IsRepG2 + state;
            IF_BIT_0(prob)
            {
              UPDATE_0(prob);
              distance = rep2;
            }
            else
            {
              UPDATE_1(prob);
              distance = rep3;
              rep3 = rep2;
            }
            rep2 = rep1;
          }
          rep1 = rep0;
          rep0 = distance;
        }
        state = state < kNumLitStates ? 8 : 11;
        prob = probs + RepLenCoder;
      }
      
      #ifdef _LZMA_SIZE_OPT
      {
        unsigned limit, offset;
        CLzmaProb *probLen = prob + LenChoice;
        IF_BIT_0(probLen)
        {
          UPDATE_0(probLen);
          probLen = prob + LenLow + (posState << kLenNumLowBits);
          offset = 0;
          limit = (1 << kLenNumLowBits);
        }
        else
        {
          UPDATE_1(probLen);
          probLen = prob + LenChoice2;
          IF_BIT_0(probLen)
          {
            UPDATE_0(probLen);
            probLen = prob + LenMid + (posState << kLenNumMidBits);
            offset = kLenNumLowSymbols;
            limit = (1 << kLenNumMidBits);
          }
          else
          {
            UPDATE_1(probLen);
            probLen = prob + LenHigh;
            offset = kLenNumLowSymbols + kLenNumMidSymbols;
            limit = (1 << kLenNumHighBits);
          }
        }
        TREE_DECODE(probLen, limit, len);
        len += offset;
      }
      #else
      {
        CLzmaProb *probLen = prob + LenChoice;
        IF_BIT_0(probLen)
        {
          UPDATE_0(probLen);
          probLen = prob + LenLow + (posState << kLenNumLowBits);
          len = 1;
          TREE_GET_BIT(probLen, len);
          TREE_GET_BIT(probLen, len);
          TREE_GET_BIT(probLen, len);
          len -= 8;
        }
        else
        {
          UPDATE_1(probLen);
          probLen = prob + LenChoice2;
          IF_BIT_0(probLen)
          {
            UPDATE_0(probLen);
            probLen = prob + LenMid + (posState << kLenNumMidBits);
            len = 1;
            TREE_GET_BIT(probLen, len);
            TREE_GET_BIT(probLen, len);
            TREE_GET_BIT(probLen, len);
          }
          else
          {
            UPDATE_1(probLen);
            probLen = prob + LenHigh;
            TREE_DECODE(probLen, (1 << kLenNumHighBits), len);
            len += kLenNumLowSymbols + kLenNumMidSymbols;
          }
        }
      }